

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmem.c
# Opt level: O2

void build_pkt(void *buf,int len,uint id)

{
  ushort uVar1;
  in_addr_t iVar2;
  
  memset(buf,0,(long)len);
  *(undefined4 *)((long)buf + 6) = 0x4030201;
  *(undefined2 *)((long)buf + 10) = 0x605;
  *(undefined4 *)buf = 0xffffffff;
  *(undefined2 *)((long)buf + 4) = 0xffff;
  *(undefined4 *)((long)buf + 0xc) = 0x450008;
  *(undefined2 *)((long)buf + 0x12) = 0;
  uVar1 = (short)len - 0xe;
  *(ushort *)((long)buf + 0x10) = uVar1 * 0x100 | uVar1 >> 8;
  *(undefined4 *)((long)buf + 0x14) = 0x11100000;
  *(undefined2 *)((long)buf + 0x18) = 0;
  iVar2 = inet_addr("10.0.0.2");
  *(in_addr_t *)((long)buf + 0x1a) = iVar2;
  iVar2 = inet_addr("10.0.0.1");
  *(in_addr_t *)((long)buf + 0x1e) = iVar2;
  uVar1 = (short)len - 0x22;
  *(ushort *)((long)buf + 0x26) = uVar1 * 0x100 | uVar1 >> 8;
  *(undefined2 *)((long)buf + 0x24) = 0x60ea;
  *(ushort *)((long)buf + 0x22) = (ushort)id << 8 | (ushort)id >> 8;
  *(undefined2 *)((long)buf + 0x28) = 0;
  return;
}

Assistant:

void build_pkt(void *buf, int len, unsigned int id)
{
	struct ether_header *eth;
	struct ip *ip;
	struct udphdr *udp;

	memset(buf, 0, len);

	eth = (struct ether_header *)buf;
	eth->ether_shost[0] = 0x01;
	eth->ether_shost[1] = 0x02;
	eth->ether_shost[2] = 0x03;
	eth->ether_shost[3] = 0x04;
	eth->ether_shost[4] = 0x05;
	eth->ether_shost[5] = 0x06;

	eth->ether_dhost[0] = 0xff;
	eth->ether_dhost[1] = 0xff;
	eth->ether_dhost[2] = 0xff;
	eth->ether_dhost[3] = 0xff;
	eth->ether_dhost[4] = 0xff;
	eth->ether_dhost[5] = 0xff;

	eth->ether_type = htons(ETHERTYPE_IP);

	ip = (struct ip*)(eth + 1);
	ip->ip_v	= IPVERSION;
	ip->ip_hl       = 5;
	ip->ip_id       = 0;
	ip->ip_tos      = 0;
	ip->ip_len      = htons(len - sizeof(*eth));
	ip->ip_off      = 0;
	ip->ip_ttl      = 16;
	ip->ip_p	= IPPROTO_UDP;
	ip->ip_sum      = 0;
	ip->ip_src.s_addr = inet_addr("10.0.0.2");
	ip->ip_dst.s_addr = inet_addr("10.0.0.1");


	udp = (struct udphdr*)(ip + 1);
	udp->uh_ulen    = htons(len - sizeof(*eth) - sizeof(*ip));
	udp->uh_dport   = htons(60000);
	udp->uh_sport   = htons(id);
	udp->uh_sum     = 0;
}